

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

FTexture * __thiscall FTextureManager::operator()(FTextureManager *this,char *texname)

{
  FTextureID FVar1;
  FTexture *pFVar2;
  
  pFVar2 = (FTexture *)0x0;
  FVar1 = GetTexture(this,texname,8,0);
  if (FVar1.texnum != -1) {
    pFVar2 = (this->Textures).Array[(this->Translation).Array[FVar1.texnum]].Texture;
  }
  return pFVar2;
}

Assistant:

FTexture *operator() (const char *texname)
	{
		FTextureID texnum = GetTexture (texname, FTexture::TEX_MiscPatch);
		if (texnum.texnum == -1) return NULL;
		return Textures[Translation[texnum.texnum]].Texture;
	}